

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::SetOneof2<proto2_unittest::TestOneof2>(TestOneof2 *message)

{
  Arena *arena;
  
  proto2_unittest::TestOneof2::set_foo_int(message,200);
  proto2_unittest::TestOneof2::set_bar_enum(message,TestOneof2_NestedEnum_BAZ);
  (message->field_0)._impl_.baz_int_ = 0xca;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 3;
  arena = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.baz_string_,"203",arena);
  return;
}

Assistant:

void SetOneof2(TestOneof2* message) {
  message->set_foo_int(200);
  message->set_bar_enum(TestOneof2::BAZ);
  message->set_baz_int(202);
  message->set_baz_string("203");
}